

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatbuffer_builder.h
# Opt level: O2

uint __thiscall
flatbuffers::FlatBufferBuilderImpl<false>::PushElement<unsigned_long,unsigned_int>
          (FlatBufferBuilderImpl<false> *this,unsigned_long element)

{
  unsigned_long local_18;
  
  Align(this,8);
  local_18 = element;
  vector_downward<unsigned_int>::push_small<unsigned_long>(&this->buf_,&local_18);
  return (this->buf_).size_;
}

Assistant:

ReturnT PushElement(T element) {
    AssertScalarT<T>();
    Align(sizeof(T));
    buf_.push_small(EndianScalar(element));
    return CalculateOffset<ReturnT>();
  }